

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_device_init__null(ma_context *pContext,ma_device_config *pConfig,ma_device *pDevice)

{
  uint uVar1;
  ma_result mVar2;
  size_t i;
  long lVar3;
  ma_uint32 mVar4;
  
  if (pDevice == (ma_device *)0x0) {
    __assert_fail("pDevice != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x2505,
                  "ma_result ma_device_init__null(ma_context *, const ma_device_config *, ma_device *)"
                 );
  }
  memset(&pDevice->field_23,0,0x110);
  mVar2 = -0x65;
  if (pConfig->deviceType != ma_device_type_loopback) {
    mVar4 = pConfig->periodSizeInFrames;
    if (mVar4 == 0) {
      mVar4 = (pConfig->sampleRate / 1000) * pConfig->periodSizeInMilliseconds;
    }
    if ((pConfig->deviceType & ~ma_device_type_playback) == ma_device_type_capture) {
      lVar3 = 0;
      do {
        (pDevice->capture).name[lVar3] = "NULL Capture Device"[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x13);
      (pDevice->capture).name[0x13] = '\0';
      (pDevice->capture).internalFormat = (pConfig->capture).format;
      uVar1 = (pConfig->capture).channels;
      (pDevice->capture).internalChannels = uVar1;
      if ((ulong)uVar1 != 0) {
        memcpy((pDevice->capture).internalChannelMap,(pConfig->capture).channelMap,(ulong)uVar1);
      }
      (pDevice->capture).internalPeriodSizeInFrames = mVar4;
      (pDevice->capture).internalPeriods = pConfig->periods;
    }
    if ((pConfig->deviceType | ma_device_type_capture) == ma_device_type_duplex) {
      lVar3 = 0;
      do {
        (pDevice->playback).name[lVar3] = "NULL Playback Device"[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x14);
      (pDevice->playback).name[0x14] = '\0';
      (pDevice->playback).internalFormat = (pConfig->playback).format;
      uVar1 = (pConfig->playback).channels;
      (pDevice->playback).internalChannels = uVar1;
      if ((ulong)uVar1 != 0) {
        memcpy((pDevice->playback).internalChannelMap,(pConfig->playback).channelMap,(ulong)uVar1);
      }
      (pDevice->playback).internalPeriodSizeInFrames = mVar4;
      (pDevice->playback).internalPeriods = pConfig->periods;
    }
    mVar2 = ma_event_init(pContext,&(pDevice->field_23).null_device.operationEvent);
    if (mVar2 == 0) {
      mVar2 = ma_event_init(pContext,&(pDevice->field_23).null_device.operationCompletionEvent);
      if (mVar2 == 0) {
        mVar2 = ma_thread_create(pContext,&pDevice->thread,ma_device_thread__null,pDevice);
        return mVar2;
      }
    }
  }
  return mVar2;
}

Assistant:

static ma_result ma_device_init__null(ma_context* pContext, const ma_device_config* pConfig, ma_device* pDevice)
{
    ma_result result;
    ma_uint32 periodSizeInFrames;

    MA_ASSERT(pDevice != NULL);

    MA_ZERO_OBJECT(&pDevice->null_device);

    if (pConfig->deviceType == ma_device_type_loopback) {
        return MA_DEVICE_TYPE_NOT_SUPPORTED;
    }

    periodSizeInFrames = pConfig->periodSizeInFrames;
    if (periodSizeInFrames == 0) {
        periodSizeInFrames = ma_calculate_buffer_size_in_frames_from_milliseconds(pConfig->periodSizeInMilliseconds, pConfig->sampleRate);
    }

    if (pConfig->deviceType == ma_device_type_capture || pConfig->deviceType == ma_device_type_duplex) {
        ma_strncpy_s(pDevice->capture.name,  sizeof(pDevice->capture.name),  "NULL Capture Device",  (size_t)-1);
        pDevice->capture.internalFormat             = pConfig->capture.format;
        pDevice->capture.internalChannels           = pConfig->capture.channels;
        ma_channel_map_copy(pDevice->capture.internalChannelMap, pConfig->capture.channelMap, pConfig->capture.channels);
        pDevice->capture.internalPeriodSizeInFrames = periodSizeInFrames;
        pDevice->capture.internalPeriods            = pConfig->periods;
    }
    if (pConfig->deviceType == ma_device_type_playback || pConfig->deviceType == ma_device_type_duplex) {
        ma_strncpy_s(pDevice->playback.name, sizeof(pDevice->playback.name), "NULL Playback Device", (size_t)-1);
        pDevice->playback.internalFormat             = pConfig->playback.format;
        pDevice->playback.internalChannels           = pConfig->playback.channels;
        ma_channel_map_copy(pDevice->playback.internalChannelMap, pConfig->playback.channelMap, pConfig->playback.channels);
        pDevice->playback.internalPeriodSizeInFrames = periodSizeInFrames;
        pDevice->playback.internalPeriods            = pConfig->periods;
    }

    /*
    In order to get timing right, we need to create a thread that does nothing but keeps track of the timer. This timer is started when the
    first period is "written" to it, and then stopped in ma_device_stop__null().
    */
    result = ma_event_init(pContext, &pDevice->null_device.operationEvent);
    if (result != MA_SUCCESS) {
        return result;
    }

    result = ma_event_init(pContext, &pDevice->null_device.operationCompletionEvent);
    if (result != MA_SUCCESS) {
        return result;
    }

    result = ma_thread_create(pContext, &pDevice->thread, ma_device_thread__null, pDevice);
    if (result != MA_SUCCESS) {
        return result;
    }

    return MA_SUCCESS;
}